

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree.cpp
# Opt level: O0

void __thiscall Segtree::unlazy(Segtree *this)

{
  int _r;
  Segtree *pSVar1;
  int mid;
  Segtree *this_local;
  
  this->val = this->lazy + this->val;
  if (this->l != this->r) {
    if (this->lson == (Segtree *)0x0) {
      _r = (this->l + this->r) / 2;
      pSVar1 = (Segtree *)operator_new(0x30);
      Segtree(pSVar1,this->l,_r);
      this->lson = pSVar1;
      pSVar1 = (Segtree *)operator_new(0x30);
      Segtree(pSVar1,_r,this->r);
      this->rson = pSVar1;
    }
    this->lson->lazy = this->lazy + this->lson->lazy;
    this->rson->lazy = this->lazy + this->rson->lazy;
    this->lazy = 0;
  }
  return;
}

Assistant:

void unlazy() {
        val += lazy;
        if (l == r) return;
        if(lson == NULL) {
            int mid = (l+r)/2;
            lson = new Segtree(l, mid);
            rson = new Segtree(mid, r);
        }
        lson->lazy += lazy; // <- Propagate
        rson->lazy += lazy;
        lazy = 0;
    }